

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Stress::anon_unknown_0::FramebufferRenderCase::deinit(FramebufferRenderCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  if (this->m_texID != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->m_texID);
    this->m_texID = 0;
  }
  if (this->m_fboID != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x440))(1,&this->m_fboID);
    this->m_fboID = 0;
  }
  return;
}

Assistant:

void FramebufferRenderCase::deinit (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_texID)
	{
		gl.deleteTextures(1, &m_texID);
		m_texID = 0;
	}

	if (m_fboID)
	{
		gl.deleteFramebuffers(1, &m_fboID);
		m_fboID = 0;
	}
}